

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_getlocal(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  lua_Integer lVar4;
  int level;
  int nvar;
  char *name;
  lua_Debug ar;
  lua_State *L1;
  lua_State *plStack_18;
  int arg;
  lua_State *L_local;
  
  plStack_18 = L;
  ar.i_ci = (CallInfo *)getthread(L,(int *)((long)&L1 + 4));
  lVar2 = luaL_checkinteger(plStack_18,L1._4_4_ + 2);
  iVar1 = lua_type(plStack_18,L1._4_4_ + 1);
  if (iVar1 == 6) {
    lua_pushvalue(plStack_18,L1._4_4_ + 1);
    L_00 = plStack_18;
    pcVar3 = lua_getlocal(plStack_18,(lua_Debug *)0x0,(int)lVar2);
    lua_pushstring(L_00,pcVar3);
    L_local._4_4_ = 1;
  }
  else {
    lVar4 = luaL_checkinteger(plStack_18,L1._4_4_ + 1);
    iVar1 = lua_getstack((lua_State *)ar.i_ci,(int)lVar4,(lua_Debug *)&name);
    if (iVar1 == 0) {
      L_local._4_4_ = luaL_argerror(plStack_18,L1._4_4_ + 1,"level out of range");
    }
    else {
      checkstack(plStack_18,(lua_State *)ar.i_ci,1);
      pcVar3 = lua_getlocal((lua_State *)ar.i_ci,(lua_Debug *)&name,(int)lVar2);
      if (pcVar3 == (char *)0x0) {
        lua_pushnil(plStack_18);
        L_local._4_4_ = 1;
      }
      else {
        lua_xmove((lua_State *)ar.i_ci,plStack_18,1);
        lua_pushstring(plStack_18,pcVar3);
        lua_rotate(plStack_18,-2,1);
        L_local._4_4_ = 2;
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int db_getlocal(lua_State *L) {
    int arg;
    lua_State *L1 = getthread(L, &arg);
    lua_Debug ar;
    const char *name;
    int nvar = (int) luaL_checkinteger(L, arg + 2);  /* local-variable index */
    if (lua_isfunction(L, arg + 1)) {  /* function argument? */
        lua_pushvalue(L, arg + 1);  /* push function */
        lua_pushstring(L, lua_getlocal(L, NULL, nvar));  /* push local name */
        return 1;  /* return only name (there is no value) */
    } else {  /* stack-level argument */
        int level = (int) luaL_checkinteger(L, arg + 1);
        if (!lua_getstack(L1, level, &ar))  /* out of range? */
            return luaL_argerror(L, arg + 1, "level out of range");
        checkstack(L, L1, 1);
        name = lua_getlocal(L1, &ar, nvar);
        if (name) {
            lua_xmove(L1, L, 1);  /* move local value */
            lua_pushstring(L, name);  /* push name */
            lua_rotate(L, -2, 1);  /* re-order */
            return 2;
        } else {
            lua_pushnil(L);  /* no name (nor value) */
            return 1;
        }
    }
}